

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverRandom.cpp
# Opt level: O0

double __thiscall BGCG_SolverRandom::Solve(BGCG_SolverRandom *this)

{
  ulong uVar1;
  size_t sVar2;
  type pJVar3;
  BayesianGameIdenticalPayoffSolver *this_00;
  long *in_RDI;
  JPPV_sharedPtr jpolBG;
  JPPV_sharedPtr temp;
  Index i;
  double value;
  JointPolicyPureVector *in_stack_ffffffffffffff68;
  shared_ptr<JointPolicyPureVector> *this_01;
  shared_ptr<JointPolicyPureVector> local_48;
  JointPolicyPureVector *in_stack_ffffffffffffffc8;
  shared_ptr<JointPolicyPureVector> local_28;
  uint local_14;
  double local_10;
  
  local_10 = 0.0;
  local_14 = 0;
  while( true ) {
    uVar1 = (ulong)local_14;
    sVar2 = BayesianGameIdenticalPayoffSolver::GetNrDesiredSolutions
                      ((BayesianGameIdenticalPayoffSolver *)0x896baa);
    if (uVar1 == sVar2) break;
    (**(code **)(*in_RDI + 0x38))();
    this_01 = &local_28;
    boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
              ((shared_ptr<JointPolicyDiscretePure> *)this_01);
    boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<JointPolicyDiscretePure> *)0x896bf1);
    boost::shared_ptr<JointPolicyPureVector>::operator*(this_01);
    boost::make_shared<JointPolicyPureVector,JointPolicyPureVector&>(in_stack_ffffffffffffffc8);
    pJVar3 = boost::shared_ptr<JointPolicyPureVector>::operator->(&local_48);
    (*(pJVar3->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[0xe])();
    this_00 = (BayesianGameIdenticalPayoffSolver *)
              boost::shared_ptr<JointPolicyPureVector>::operator*(&local_48);
    BayesianGameIdenticalPayoffSolver::AddSolution
              (this_00,in_stack_ffffffffffffff68,4.449640679803e-317);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x896c69);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x896c73);
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

double BGCG_SolverRandom::Solve()
{
    double value = 0.0;
    for(Index i=0;i!=GetNrDesiredSolutions();++i)
    {
        //translate found configuration to jpol
        JPPV_sharedPtr temp = boost::dynamic_pointer_cast<JointPolicyPureVector>( GetNewJpol() );
        JPPV_sharedPtr jpolBG=boost::make_shared<JointPolicyPureVector>(*temp);
//        delete temp;
        jpolBG->RandomInitialization();

        //store the solution
        AddSolution(*jpolBG,value);
    }

    return(value);
}